

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O3

long __thiscall
glcts::anon_unknown_0::UniformLocNegativeLinkMaxLocation::Run
          (UniformLocNegativeLinkMaxLocation *this)

{
  long lVar1;
  Loc _location;
  GLint max;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  uint local_29c;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  local_298;
  UniformType local_278;
  Uniform local_1e8;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,(GLint *)&local_29c);
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniformType::UniformType(&local_278,0x8b52,0);
  _location.super_LayoutSpecifierBase.numSys = Dec;
  _location.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
  _location.super_LayoutSpecifierBase.val = local_29c;
  Uniform::Uniform(&local_1e8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
                   &local_278,_location,(DefOccurence)0x2,(DefOccurence)0x0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back(&local_298,&local_1e8);
  Uniform::~Uniform(&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.refStrType._M_dataplus._M_p != &local_278.refStrType.field_2) {
    operator_delete(local_278.refStrType._M_dataplus._M_p,
                    local_278.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278.strType._M_dataplus._M_p != &local_278.strType.field_2) {
    operator_delete(local_278.strType._M_dataplus._M_p,
                    local_278.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_278.childTypes);
  if (local_278.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.arraySizesSegmented.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,&local_298);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector(&local_298);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = X) uniform float u0;
		//Where X is substituted with value of GL_MAX_UNIFORM_LOCATIONS.

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(max), DefOccurence::FSH_OR_CSH));

		return doRunNegativeLink(uniforms);
	}